

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O3

Iterator * __thiscall spvtools::EnumSet<spvtools::Extension>::Iterator::operator++(Iterator *this)

{
  EnumSet<spvtools::Extension> *this_00;
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong bucketIndex;
  
  while( true ) {
    this_00 = this->set_;
    bucketIndex = this->bucketIndex_;
    uVar2 = (long)(this_00->buckets_).
                  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->buckets_).
                  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar2 <= bucketIndex) {
      this->bucketIndex_ = uVar2;
      this->bucketOffset_ = 0;
      return this;
    }
    uVar3 = this->bucketOffset_ + 1;
    if (uVar3 == 0x40) {
      bucketIndex = bucketIndex + 1;
      this->bucketIndex_ = bucketIndex;
      uVar3 = 0;
    }
    this->bucketOffset_ = uVar3;
    if (uVar2 <= bucketIndex) break;
    bVar1 = HasEnumAt(this_00,bucketIndex,(ulong)uVar3);
    if (bVar1) {
      return this;
    }
  }
  return this;
}

Assistant:

Iterator& operator++() {
      do {
        if (bucketIndex_ >= set_->buckets_.size()) {
          bucketIndex_ = set_->buckets_.size();
          bucketOffset_ = 0;
          break;
        }

        if (bucketOffset_ + 1 == kBucketSize) {
          bucketOffset_ = 0;
          ++bucketIndex_;
        } else {
          ++bucketOffset_;
        }

      } while (bucketIndex_ < set_->buckets_.size() &&
               !set_->HasEnumAt(bucketIndex_, bucketOffset_));
      return *this;
    }